

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.cpp
# Opt level: O0

TestResult *
JsonTest::checkStringEqual
          (TestResult *result,string *expected,string *actual,char *file,uint line,char *expr)

{
  bool bVar1;
  undefined8 in_RCX;
  uint line_00;
  char *in_RDX;
  TestResult *in_RSI;
  TestResult *in_RDI;
  undefined4 in_R8D;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000178;
  TestResult *in_stack_00000180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  
  line_00 = (uint)((ulong)in_RCX >> 0x20);
  bVar1 = std::operator!=(in_R9,in_stack_ffffffffffffffc8);
  if (bVar1) {
    TestResult::addFailure(in_RSI,in_RDX,line_00,(char *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8))
    ;
    TestResult::operator<<(in_stack_00000180,(char (*) [12])in_stack_00000178);
    TestResult::operator<<(in_stack_00000180,in_stack_00000178);
    TestResult::operator<<(in_stack_00000180,(char (*) [3])in_stack_00000178);
    TestResult::operator<<(in_stack_00000180,(char (*) [12])in_stack_00000178);
    TestResult::operator<<(in_stack_00000180,in_stack_00000178);
    TestResult::operator<<(in_stack_00000180,(char (*) [2])in_stack_00000178);
  }
  return in_RDI;
}

Assistant:

TestResult& checkStringEqual(TestResult& result,
                             const std::string& expected,
                             const std::string& actual,
                             const char* file,
                             unsigned int line,
                             const char* expr) {
  if (expected != actual) {
    result.addFailure(file, line, expr);
    result << "Expected: '" << expected << "'\n";
    result << "Actual  : '" << actual << "'";
  }
  return result;
}